

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O3

void __thiscall ON_3dmProperties::Dump(ON_3dmProperties *this,ON_TextLog *dump)

{
  bool bVar1;
  int iVar2;
  
  ON_TextLog::Print(dump,"Revision history:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmRevisionHistory::Dump(&this->m_RevisionHistory,dump);
  ON_TextLog::PopIndent(dump);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Notes:\n");
  iVar2 = ON_wString::Length(&(this->m_Notes).m_notes);
  if (0 < iVar2) {
    ON_TextLog::PushIndent(dump);
    ON_3dmNotes::Dump(&this->m_Notes,dump);
    ON_TextLog::PopIndent(dump);
  }
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"Application information:\n");
  ON_TextLog::PushIndent(dump);
  ON_3dmApplication::Dump(&this->m_Application,dump);
  ON_TextLog::PopIndent(dump);
  bVar1 = ON_WindowsBitmap::IsValid(&this->m_PreviewImage,(ON_TextLog *)0x0);
  if (bVar1) {
    ON_TextLog::Print(dump,"\n");
    ON_TextLog::Print(dump,"Preview image:\n");
    ON_TextLog::PushIndent(dump);
    ON_Bitmap::Dump(&(this->m_PreviewImage).super_ON_Bitmap,dump);
    ON_TextLog::PopIndent(dump);
    return;
  }
  return;
}

Assistant:

void ON_3dmProperties::Dump( ON_TextLog& dump ) const
{
  dump.Print("Revision history:\n");
  dump.PushIndent();
  m_RevisionHistory.Dump(dump);
  dump.PopIndent();

  dump.Print("\n");
  dump.Print("Notes:\n");
  if ( m_Notes.m_notes.Length() > 0 ) {
    dump.PushIndent();
    m_Notes.Dump(dump);
    dump.PopIndent();
  }

  dump.Print("\n");
  dump.Print("Application information:\n");
  dump.PushIndent();
  m_Application.Dump(dump);
  dump.PopIndent();

  if ( m_PreviewImage.IsValid() ) {
    dump.Print("\n");
    dump.Print("Preview image:\n");
    dump.PushIndent();
    m_PreviewImage.Dump(dump);
    dump.PopIndent();
  }
}